

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

bool __thiscall
presolve::HPresolve::convertImpliedInteger
          (HPresolve *this,HighsInt col,HighsInt row,bool skipInputChecks)

{
  int *piVar1;
  HighsLp *pHVar2;
  pointer piVar3;
  pointer piVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  
  if (((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[col] == '\0') &&
     ((skipInputChecks ||
      (((this->model->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_start[col] == kContinuous &&
       (bVar5 = isImpliedInteger(this,col), bVar5)))))) {
    pHVar2 = this->model;
    (pHVar2->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
    super__Vector_impl_data._M_start[col] = kImplicitInteger;
    if (row == -1) {
      lVar7 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[col];
      if (lVar7 != -1) {
        piVar3 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar7;
        piVar4 = (this->rowsizeImplInt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          piVar1 = piVar4 + *piVar8;
          *piVar1 = *piVar1 + 1;
          iVar6 = (int)lVar7;
          lVar7 = (long)piVar3[iVar6];
          piVar8 = piVar8 + (lVar7 - iVar6);
        } while (lVar7 != -1);
      }
    }
    else {
      piVar8 = (this->rowsizeImplInt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + row;
      *piVar8 = *piVar8 + 1;
    }
    changeColLower(this,col,(pHVar2->col_lower_).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start[col]);
    changeColUpper(this,col,(this->model->col_upper_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[col]);
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool HPresolve::convertImpliedInteger(HighsInt col, HighsInt row,
                                      bool skipInputChecks) {
  // return if column was deleted
  if (colDeleted[col]) return false;

  // return if column is not continuous or cannot be converted to an implied
  // integer
  if (!skipInputChecks &&
      (model->integrality_[col] != HighsVarType::kContinuous ||
       !isImpliedInteger(col)))
    return false;

  // convert to implied integer
  model->integrality_[col] = HighsVarType::kImplicitInteger;

  if (row != -1) {
    // use row index supplied by caller (e.g. singleton)
    ++rowsizeImplInt[row];
  } else {
    // iterate over rows
    for (const HighsSliceNonzero& nonzero : getColumnVector(col))
      ++rowsizeImplInt[nonzero.index()];
  }

  // round and update bounds
  changeColLower(col, model->col_lower_[col]);
  changeColUpper(col, model->col_upper_[col]);
  return true;
}